

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_wrapper.hpp
# Opt level: O3

future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> __thiscall
HttpWrapper::httpPost(HttpWrapper *this,Options *opts,Handler *handler)

{
  thread *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> fVar1;
  packaged_task<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_(const_HttpWrapper::Options_&,_const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_&)>
  task;
  reference_wrapper<const_HttpWrapper::Options> local_40;
  packaged_task<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_(const_HttpWrapper::Options_&,_const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_&)>
  local_38;
  reference_wrapper<const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_>
  local_28;
  
  std::
  __create_task_state<std::tuple<HttpWrapper::_Error,HttpWrapper::_Response>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&),HttpWrapper::httpPost(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)::__0,std::allocator<int>>
            ((anon_class_1_0_00000001_for__M_fn *)&local_38,(allocator<int> *)&local_40);
  std::
  packaged_task<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_(const_HttpWrapper::Options_&,_const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_&)>
  ::get_future((packaged_task<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_(const_HttpWrapper::Options_&,_const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_&)>
                *)this);
  this_00 = (thread *)operator_new(8);
  local_40._M_data = opts;
  local_28._M_data = handler;
  std::thread::
  thread<std::packaged_task<std::tuple<HttpWrapper::_Error,HttpWrapper::_Response>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)>,std::reference_wrapper<HttpWrapper::Options_const>,std::reference_wrapper<std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const>,void>
            (this_00,&local_38,&local_40,&local_28);
  std::thread::detach();
  std::
  packaged_task<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_(const_HttpWrapper::Options_&,_const_std::function<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&)>_&)>
  ::~packaged_task(&local_38);
  fVar1.super___basic_future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar1.super___basic_future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>)
         fVar1.super___basic_future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>.
         _M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

future<tuple<Error, Response>> httpPost(const Options& opts, const Handler& handler) {
        packaged_task<tuple<Error, Response>(const Options&, const Handler&)> task(
                [](const Options& opts, const Handler& handler)
                        -> tuple<Error, Response> {
                    CURL* curl;
                    CURLcode res;
                    string buffer;
                    Response response;
                    Error error;

                    curl = curl_easy_init();
                    if (curl) {
                        struct curl_slist* chunk = NULL;
                        {
                            for(auto header : opts.headers) {
                                stringstream ss;
                                ss << header.first << ":" << header.second;
                                chunk = curl_slist_append(chunk, ss.str().c_str());
                            }
                        }

                        const string contentType = opts.headers.at("content-type");
                        if (contentType.compare("multipart/form-data")) {
                            if (opts.form.size()) {
                                curl_mime* form =  NULL;
                                curl_mimepart* field = NULL;

                                form = curl_mime_init(curl);
                                for (auto f : opts.form) {
                                    field = curl_mime_addpart(form);
                                    curl_mime_name(field, f.first.c_str());
                                    curl_mime_data(field, f.second.c_str(), CURL_ZERO_TERMINATED);
                                }
                                curl_easy_setopt(curl, CURLOPT_MIMEPOST, form);
                            }
                        } else {
                            string forms;
                            {
                                if (opts.form.size() ) {
                                    for (auto f : opts.form) {
                                        forms.append(f.first + "=" + f.second + "&");
                                    }
                                    curl_easy_setopt(curl, CURLOPT_POSTFIELDS, forms.c_str());
                                }
                            }
                        }

                        curl_easy_setopt(curl, CURLOPT_URL, opts.url);
                        curl_easy_setopt(curl, CURLOPT_HTTPHEADER, chunk);
                        curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, write_data);
                        curl_easy_setopt(curl, CURLOPT_WRITEDATA, &buffer);

                        res = curl_easy_perform(curl);
                        if (res != CURLE_OK) {
                            error.code = res;
                        } else {
                            response.data = buffer;
                        }
                        curl_easy_cleanup(curl);
                    }

                    handler(error, response);
                    return tuple<Error, Response>(error, response);
                });

        future<tuple<Error, Response>> ret = task.get_future();
        thread* t = new thread(move(task), ref(opts), ref(handler));
        t->detach();

        return ret;
    }